

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_patch_variables(Impl *this)

{
  ResourceRemappingInterface *pRVar1;
  uint uVar2;
  bool bVar3;
  ComponentType element_type;
  bool bVar4;
  char cVar5;
  StorageClass storage;
  uint uVar6;
  uint uVar7;
  uint cols;
  uint uVar8;
  uint uVar9;
  Id IVar10;
  Id IVar12;
  MDOperand *pMVar13;
  MDNode *pMVar14;
  Module *module;
  Builder *this_00;
  MDNode *node;
  MDNode *node_00;
  mapped_type *pmVar15;
  byte bVar16;
  undefined8 in_RCX;
  ulong uVar17;
  uint u;
  Decoration decoration;
  uint *t;
  Semantic semantic;
  ComponentType type;
  uint index;
  uint rows;
  BuiltIn builtin;
  bool bVar18;
  Id local_ec;
  uint local_d4;
  uint semantic_index;
  VulkanStageIO vk_io;
  uint element_id;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_98;
  D3DStageIO d3d_io;
  String semantic_name;
  String variable_name;
  int iVar11;
  
  pMVar14 = this->entry_point_meta;
  pMVar13 = LLVMBC::MDNode::getOperand(pMVar14,2);
  uVar17 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (pMVar13->kind != None) {
    pMVar13 = LLVMBC::MDNode::getOperand(pMVar14,2);
    pMVar14 = LLVMBC::cast<LLVMBC::MDNode>(pMVar13);
    pMVar13 = LLVMBC::MDNode::getOperand(pMVar14,2);
    if (pMVar13->kind != None) {
      u = 0;
      bVar3 = false;
      if (this->execution_model == ExecutionModelTessellationControl) {
        module = LLVMBCParser::get_module(this->bitcode_parser);
        bVar3 = module_is_dxilconv(module);
      }
      pMVar14 = LLVMBC::dyn_cast<LLVMBC::MDNode>(pMVar13);
      this_00 = SPIRVModule::get_builder(this->spirv_module);
      bVar18 = this->execution_model != ExecutionModelTessellationEvaluation;
      storage = bVar18 + 1 + (uint)bVar18;
      local_98 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->patch_elements_meta;
      index = 0;
      while( true ) {
        uVar7 = (uint)uVar17;
        uVar6 = LLVMBC::MDNode::getNumOperands(pMVar14);
        if (uVar6 <= index) break;
        pMVar13 = LLVMBC::MDNode::getOperand(pMVar14,index);
        node = LLVMBC::cast<LLVMBC::MDNode>(pMVar13);
        local_d4 = 0;
        element_id = get_constant_metadata<unsigned_int>(node,0);
        get_string_metadata_abi_cxx11_(&semantic_name,(dxil_spv *)node,(MDNode *)0x1,uVar7);
        uVar6 = get_constant_metadata<unsigned_int>(node,2);
        bVar16 = (ComponentType)uVar6 - SNormF16;
        type = (ComponentType)(0xa0a09090808 >> (bVar16 * '\b' & 0x3f));
        if (5 < bVar16) {
          type = (ComponentType)uVar6;
        }
        element_type = get_effective_input_output_type(this,type);
        uVar6 = get_constant_metadata<unsigned_int>(node,3);
        semantic_index = 0;
        pMVar13 = LLVMBC::MDNode::getOperand(node,4);
        if (pMVar13->kind != None) {
          pMVar13 = LLVMBC::MDNode::getOperand(node,4);
          node_00 = LLVMBC::cast<LLVMBC::MDNode>(pMVar13);
          local_d4 = get_constant_metadata<unsigned_int>(node_00,0);
          semantic_index = local_d4;
        }
        uVar7 = get_constant_metadata<unsigned_int>(node,6);
        cols = get_constant_metadata<unsigned_int>(node,7);
        uVar8 = get_constant_metadata<unsigned_int>(node,8);
        uVar9 = get_constant_metadata<unsigned_int>(node,9);
        semantic = (Semantic)uVar6;
        uVar6 = uVar7;
        if (semantic == InsideTessFactor) {
          uVar6 = 2;
        }
        rows = uVar6;
        if (semantic == TessFactor) {
          rows = 4;
        }
        bVar18 = (bool)(semantic == User & bVar3);
        uVar2 = uVar6 + uVar8;
        if (uVar6 + uVar8 < u) {
          uVar2 = u;
        }
        uVar17 = (ulong)uVar2;
        if (bVar18 != false) {
          u = uVar2;
        }
        pmVar15 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_98,&element_id);
        if ((byte)(semantic - TessFactor) < 2) {
          builtin = (semantic != TessFactor) + BuiltInTessLevelOuter;
          bVar4 = SPIRVModule::has_builtin_shader_input(this->spirv_module,builtin);
          if (!bVar4) {
LAB_00115e43:
            local_ec = get_type_id(this,element_type,rows,cols,false);
            goto LAB_00115e62;
          }
          (pmVar15->super_ElementMeta).id = 0;
          (pmVar15->super_ElementMeta).component_type = Invalid;
          *(undefined3 *)&(pmVar15->super_ElementMeta).field_0x5 = 0;
          *(undefined8 *)&(pmVar15->super_ElementMeta).semantic_offset = 0;
          *(undefined8 *)((long)&pmVar15->start_row + 1) = 0;
          IVar10 = SPIRVModule::get_builtin_shader_input(this->spirv_module,builtin);
          (pmVar15->super_ElementMeta).id = IVar10;
          (pmVar15->super_ElementMeta).component_type = type;
          (pmVar15->super_ElementMeta).semantic_offset = uVar8;
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose(&semantic_name);
        }
        else {
          if (semantic != CullPrimitive) goto LAB_00115e43;
          local_ec = spv::Builder::makeBoolType(this_00);
LAB_00115e62:
          if (this->execution_model == ExecutionModelMeshEXT) {
            IVar10 = spv::Builder::makeUintConstant
                               (this_00,(this->execution_mode_meta).stage_output_num_primitive,false
                               );
            local_ec = spv::Builder::makeArrayType(this_00,local_ec,IVar10,0);
          }
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&variable_name,&semantic_name);
          if (local_d4 != 0) {
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            append(&variable_name,"_");
            to_string<unsigned_int&>((String *)&d3d_io,(dxil_spv *)&semantic_index,t);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            append(&variable_name,(String *)&d3d_io);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            _M_dispose((String *)&d3d_io);
          }
          IVar10 = create_variable(this,storage,local_ec,variable_name._M_dataplus._M_p);
          (pmVar15->super_ElementMeta).semantic_offset = 0;
          (pmVar15->super_ElementMeta).id = IVar10;
          (pmVar15->super_ElementMeta).component_type = type;
          pmVar15->start_row = uVar8;
          pmVar15->start_col = uVar9;
          pmVar15->lowering = bVar18;
          if (semantic == User) {
            vk_io.location = this->patch_location_offset + uVar8;
            vk_io.flags = 1;
            pRVar1 = this->resource_mapping_iface;
            vk_io.component = uVar9;
            if (pRVar1 != (ResourceRemappingInterface *)0x0) {
              d3d_io.semantic = semantic_name._M_dataplus._M_p;
              d3d_io.semantic_index = local_d4;
              d3d_io.start_row = uVar8;
              d3d_io.rows = uVar7;
              if (this->execution_model == ExecutionModelTessellationEvaluation) {
                iVar11 = (*pRVar1->_vptr_ResourceRemappingInterface[8])();
                cVar5 = (char)iVar11;
              }
              else {
                iVar11 = (*pRVar1->_vptr_ResourceRemappingInterface[9])(pRVar1,&d3d_io,&vk_io);
                cVar5 = (char)iVar11;
              }
              if (cVar5 == '\0') {
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                _M_dispose(&variable_name);
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                _M_dispose(&semantic_name);
                uVar17 = 0;
                goto LAB_001160c9;
              }
            }
            spv::Builder::addDecoration(this_00,IVar10,DecorationLocation,vk_io.location);
            if (vk_io.component != 0) {
              spv::Builder::addDecoration(this_00,IVar10,DecorationComponent,vk_io.component);
            }
          }
          else {
            emit_builtin_decoration(this,IVar10,semantic,storage);
          }
          decoration = DecorationPatch;
          if (this->execution_model == ExecutionModelMeshEXT) {
            decoration = DecorationPerPrimitiveEXT;
          }
          uVar17 = 0xffffffffffffffff;
          spv::Builder::addDecoration(this_00,IVar10,decoration,-1);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose(&variable_name);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose(&semantic_name);
        }
        index = index + 1;
      }
      if (u != 0) {
        IVar10 = spv::Builder::makeUintType(this_00,0x20);
        IVar10 = spv::Builder::makeVectorType(this_00,IVar10,4);
        IVar12 = spv::Builder::makeUintConstant(this_00,u,false);
        IVar10 = spv::Builder::makeArrayType(this_00,IVar10,IVar12,0);
        IVar12 = spv::Builder::makeNullConstant(this_00,IVar10);
        IVar10 = create_variable_with_initializer
                           (this,StorageClassPrivate,IVar10,IVar12,"PatchLoweringRows");
        (this->execution_mode_meta).patch_lowering_array_var_id = IVar10;
      }
    }
    uVar17 = 1;
  }
LAB_001160c9:
  return SUB81(uVar17,0);
}

Assistant:

bool Converter::Impl::emit_patch_variables()
{
	auto *node = entry_point_meta;

	if (!node->getOperand(2))
		return true;

	auto &signature = node->getOperand(2);
	auto *signature_node = llvm::cast<llvm::MDNode>(signature);
	auto &patch_variables = signature_node->getOperand(2);
	if (!patch_variables)
		return true;

	// dxilconv is broken and emits patch the fork phase in a way that is non-sensical.
	// It assumes that you can write outside the bounds of a signature element.
	// To make this work, we need to lower the patch constant variables from Private variables instead.
	bool broken_patch_variables = false;
	if (execution_model == spv::ExecutionModelTessellationControl)
		broken_patch_variables = module_is_dxilconv(bitcode_parser.get_module());

	auto *patch_node = llvm::dyn_cast<llvm::MDNode>(patch_variables);

	auto &builder = spirv_module.get_builder();

	spv::StorageClass storage =
	    execution_model == spv::ExecutionModelTessellationEvaluation ? spv::StorageClassInput : spv::StorageClassOutput;

	unsigned num_broken_user_rows = 0;

	for (unsigned i = 0; i < patch_node->getNumOperands(); i++)
	{
		auto *patch = llvm::cast<llvm::MDNode>(patch_node->getOperand(i));
		auto element_id = get_constant_metadata(patch, 0);
		auto semantic_name = get_string_metadata(patch, 1);
		auto actual_element_type = normalize_component_type(static_cast<DXIL::ComponentType>(get_constant_metadata(patch, 2)));
		auto effective_element_type = get_effective_input_output_type(actual_element_type);
		auto system_value = static_cast<DXIL::Semantic>(get_constant_metadata(patch, 3));

		unsigned semantic_index = 0;
		if (patch->getOperand(4))
			semantic_index = get_constant_metadata(llvm::cast<llvm::MDNode>(patch->getOperand(4)), 0);

		auto rows = get_constant_metadata(patch, 6);
		auto cols = get_constant_metadata(patch, 7);

		auto start_row = get_constant_metadata(patch, 8);
		auto start_col = get_constant_metadata(patch, 9);

		if (system_value == DXIL::Semantic::TessFactor)
			rows = 4;
		else if (system_value == DXIL::Semantic::InsideTessFactor)
			rows = 2;

		if (broken_patch_variables && system_value == DXIL::Semantic::User)
			num_broken_user_rows = std::max<unsigned>(num_broken_user_rows, start_row + rows);

		auto &meta = patch_elements_meta[element_id];

		// Handle case where shader declares the tess factors twice at different offsets.
		unsigned semantic_offset = 0;
		if (system_value == DXIL::Semantic::TessFactor || system_value == DXIL::Semantic::InsideTessFactor)
		{
			auto builtin = system_value == DXIL::Semantic::TessFactor ?
			               spv::BuiltInTessLevelOuter : spv::BuiltInTessLevelInner;
			if (spirv_module.has_builtin_shader_input(builtin))
			{
				meta = {};
				meta.id = spirv_module.get_builtin_shader_input(builtin);
				meta.component_type = actual_element_type;
				meta.semantic_offset = start_row;
				continue;
			}
		}

		spv::Id type_id;

		if (system_value == DXIL::Semantic::CullPrimitive)
			type_id = builder.makeBoolType();
		else
			type_id = get_type_id(effective_element_type, rows, cols);

		if (execution_model == spv::ExecutionModelMeshEXT)
		{
			type_id = builder.makeArrayType(
				type_id, builder.makeUintConstant(execution_mode_meta.stage_output_num_primitive, false), 0);
		}

		auto variable_name = semantic_name;
		if (semantic_index != 0)
		{
			variable_name += "_";
			variable_name += dxil_spv::to_string(semantic_index);
		}

		spv::Id variable_id = create_variable(storage, type_id, variable_name.c_str());
		meta.id = variable_id;
		meta.component_type = actual_element_type;
		meta.semantic_offset = semantic_offset;
		meta.start_row = start_row;
		meta.start_col = start_col;
		meta.lowering = broken_patch_variables && system_value == DXIL::Semantic::User;

		if (system_value != DXIL::Semantic::User)
		{
			emit_builtin_decoration(variable_id, system_value, storage);
		}
		else
		{
			// Patch constants are packed together with control point variables,
			// so we need to apply an offset to make this work in SPIR-V.
			// The offset is deduced from the control point I/O signature.
			// TODO: If it's possible to omit trailing CP members in domain shader, we will need to pass this offset
			// into the compiler.
			VulkanStageIO vk_io = { start_row + patch_location_offset, start_col, true };

			if (resource_mapping_iface)
			{
				D3DStageIO d3d_io = { semantic_name.c_str(), semantic_index, start_row, rows };

				if (execution_model == spv::ExecutionModelTessellationEvaluation)
				{
					if (!resource_mapping_iface->remap_stage_input(d3d_io, vk_io))
						return false;
				}
				else if (!resource_mapping_iface->remap_stage_output(d3d_io, vk_io))
					return false;
			}

			builder.addDecoration(variable_id, spv::DecorationLocation, vk_io.location);
			if (vk_io.component != 0)
				builder.addDecoration(variable_id, spv::DecorationComponent, vk_io.component);
		}

		builder.addDecoration(variable_id, execution_model == spv::ExecutionModelMeshEXT
		                                   ? spv::DecorationPerPrimitiveEXT : spv::DecorationPatch);
	}

	if (num_broken_user_rows)
	{
		spv::Id type_id = builder.makeArrayType(builder.makeVectorType(builder.makeUintType(32), 4),
		                                        builder.makeUintConstant(num_broken_user_rows), 0);
		execution_mode_meta.patch_lowering_array_var_id =
			create_variable_with_initializer(spv::StorageClassPrivate, type_id,
			                                 builder.makeNullConstant(type_id),
			                                 "PatchLoweringRows");
	}

	return true;
}